

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarBinds.h
# Opt level: O2

void __thiscall VarBind::VarBind(VarBind *this,shared_ptr<OIDType> *oid,SNMP_ERROR_STATUS error)

{
  NullType *__p;
  
  std::__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *)this,
             &oid->super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>);
  this->type = NULLTYPE;
  __p = (NullType *)operator_new(0x10);
  (__p->super_BER_CONTAINER)._type = NULLTYPE;
  (__p->super_BER_CONTAINER)._length = 0;
  (__p->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__BER_CONTAINER_00117698;
  std::__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<NullType,void>
            ((__shared_ptr<BER_CONTAINER,(__gnu_cxx::_Lock_policy)2> *)&this->value,__p);
  this->errorStatus = error;
  return;
}

Assistant:

VarBind(const SortableOIDType* oid, SNMP_ERROR_STATUS error): oid(oid->cloneOID()), type(NULLTYPE), value(new NullType()), errorStatus(error){}